

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  ulong uVar5;
  LogMessage local_90;
  ulong local_58;
  long local_50;
  ulong local_48;
  RepeatedPtrFieldBase *local_40;
  LogFinisher local_31;
  
  uVar4 = (ulong)num;
  uVar5 = (ulong)start;
  local_50 = elements;
  local_40 = &this->super_RepeatedPtrFieldBase;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x8aa);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x8ab);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if (local_40->current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x8ac);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if (0 < (int)num) {
    local_58 = uVar4;
    local_48 = uVar5;
    if (local_50 != 0) {
      if (((RepeatedPtrFieldBase *)&local_40->arena_)->arena_ == (Arena *)0x0) {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (local_40,start + (int)uVar5);
          *(Type **)(local_50 + uVar5 * 8) = pTVar3;
        }
      }
      else {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          internal::RepeatedPtrFieldBase::
          Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (local_40,start + (int)uVar5);
          psVar2 = internal::StringTypeHandler::New_abi_cxx11_((Arena *)0x0);
          std::__cxx11::string::_M_assign((string *)psVar2);
          *(string **)(local_50 + uVar5 * 8) = psVar2;
        }
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(local_40,(int)local_48,(int)local_58);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArena() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}